

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O0

void __thiscall Assimp::ASE::BaseNode::BaseNode(BaseNode *this,Type _mType,string *name)

{
  ai_real aVar1;
  ai_real qnan;
  string *name_local;
  Type _mType_local;
  BaseNode *this_local;
  
  this->mType = _mType;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  std::__cxx11::string::string((string *)&this->mParent);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->mTransform);
  aiVector3t<float>::aiVector3t(&this->mTargetPosition);
  InheritanceInfo::InheritanceInfo(&this->inherit);
  ASE::Animation::Animation(&this->mAnim);
  ASE::Animation::Animation(&this->mTargetAnim);
  this->mProcessed = false;
  aVar1 = get_qnan();
  (this->mTargetPosition).x = aVar1;
  return;
}

Assistant:

BaseNode(Type _mType, const std::string &name)
    : mType         (_mType)
    , mName         (name)
    , mProcessed    (false) {
        // Set mTargetPosition to qnan
        const ai_real qnan = get_qnan();
        mTargetPosition.x = qnan;
    }